

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_source_window.c
# Opt level: O2

zip_int64_t
window_read(zip_source_t *src,void *_ctx,void *data,zip_uint64_t len,zip_source_cmd_t cmd)

{
  undefined8 uVar1;
  int iVar2;
  zip_uint64_t zVar3;
  ulong uVar4;
  zip_int64_t zVar5;
  uint se;
  ulong uVar6;
  zip_uint8_t b [8192];
  
  switch(cmd) {
  case ZIP_SOURCE_OPEN:
    if (*(zip_t **)((long)_ctx + 0x18) != (zip_t *)0x0) {
      zVar3 = _zip_file_get_offset
                        (*(zip_t **)((long)_ctx + 0x18),*(zip_uint64_t *)((long)_ctx + 0x20),
                         (zip_error_t *)((long)_ctx + 0x98));
      if (zVar3 == 0) {
        return -1;
      }
      if (CARRY8(*(ulong *)((long)_ctx + 8),zVar3)) {
        se = 0x7fffff04;
        if (*(ulong *)((long)_ctx + 0x20) < 0x800000) {
          se = (int)*(ulong *)((long)_ctx + 0x20) << 8 | 4;
        }
        zip_error_set((zip_error_t *)((long)_ctx + 0x98),0x15,se);
        return -1;
      }
      *(zip_uint64_t *)_ctx = *_ctx + zVar3;
      *(ulong *)((long)_ctx + 8) = *(ulong *)((long)_ctx + 8) + zVar3;
      *(undefined8 *)((long)_ctx + 0x18) = 0;
    }
    if (*(char *)((long)_ctx + 0xb0) != '\x01') {
      uVar6 = 0;
      do {
        uVar4 = *_ctx;
        zVar3 = uVar4 - uVar6;
        if (uVar4 < uVar6 || zVar3 == 0) goto LAB_00110dc7;
        if (0x1fff < zVar3) {
          zVar3 = 0x2000;
        }
        zVar5 = zip_source_read(src,b,zVar3);
        if (zVar5 < 0) goto LAB_00110e26;
        uVar6 = uVar6 + zVar5;
      } while (zVar5 != 0);
      goto LAB_00110e18;
    }
    uVar4 = *_ctx;
    break;
  case ZIP_SOURCE_READ:
    if ((*(char *)((long)_ctx + 0x10) == '\x01') &&
       (uVar4 = *(long *)((long)_ctx + 8) - *(long *)((long)_ctx + 0x28), uVar4 < len)) {
      len = uVar4;
    }
    if (len == 0) {
      return 0;
    }
    if ((*(char *)((long)_ctx + 0xb0) == '\x01') &&
       (iVar2 = zip_source_seek(src,*(zip_int64_t *)((long)_ctx + 0x28),0), iVar2 < 0)) {
LAB_00110e26:
      zip_error_set_from_source((zip_error_t *)((long)_ctx + 0x98),src);
      return -1;
    }
    zVar5 = zip_source_read(src,data,len);
    if (-1 < zVar5) {
      uVar4 = *(long *)((long)_ctx + 0x28) + zVar5;
      *(ulong *)((long)_ctx + 0x28) = uVar4;
      if (zVar5 != 0) {
        return zVar5;
      }
      if (*(char *)((long)_ctx + 0x10) != '\x01') {
        return 0;
      }
      if (*(ulong *)((long)_ctx + 8) <= uVar4) {
        return 0;
      }
    }
LAB_00110e18:
    iVar2 = 0x11;
    goto LAB_00110d24;
  case ZIP_SOURCE_CLOSE:
    goto LAB_00110dce;
  case ZIP_SOURCE_STAT:
    iVar2 = _zip_stat_merge((zip_stat_t *)data,(zip_stat_t *)((long)_ctx + 0x30),
                            (zip_error_t *)((long)_ctx + 0x98));
    if (iVar2 < 0) {
      return -1;
    }
    if ((((zip_stat_t *)((long)_ctx + 0x30))->valid & 4) == 0) {
      uVar4 = *data;
      if (*(char *)((long)_ctx + 0x10) == '\x01') {
        uVar4 = uVar4 | 4;
        *(long *)((long)data + 0x18) = *(long *)((long)_ctx + 8) - *_ctx;
      }
      else if ((uVar4 & 4) != 0) {
        *(long *)((long)data + 0x18) = *(long *)((long)data + 0x18) - *_ctx;
      }
    }
    else {
      uVar4 = *data;
    }
    *(ulong *)data = ~*(ulong *)((long)_ctx + 0x70) & uVar4;
    return 0;
  case ZIP_SOURCE_ERROR:
    zVar5 = zip_error_to_data((zip_error_t *)((long)_ctx + 0x98),data,len);
    return zVar5;
  case ZIP_SOURCE_FREE:
    free(_ctx);
    return 0;
  case ZIP_SOURCE_SEEK:
    if (*(char *)((long)_ctx + 0x10) == '\0') {
      if (len < 0x10) goto LAB_00110d1b;
      if (data == (void *)0x0) {
        return -1;
      }
      if (*(int *)((long)data + 8) == 2) {
        iVar2 = zip_source_seek(src,*data,2);
        if ((iVar2 < 0) || (uVar4 = zip_source_tell(src), (long)uVar4 < 0)) {
          zip_error_set_from_source((zip_error_t *)((long)_ctx + 0x98),src);
          return -1;
        }
        if (uVar4 < *_ctx) {
          zip_error_set((zip_error_t *)((long)_ctx + 0x98),0x12,0);
          zip_source_seek(src,*(zip_int64_t *)((long)_ctx + 0x28),0);
          return -1;
        }
        break;
      }
    }
    zVar5 = zip_source_seek_compute_offset
                      (*(long *)((long)_ctx + 0x28) - *_ctx,*(long *)((long)_ctx + 8) - *_ctx,data,
                       len,(zip_error_t *)((long)_ctx + 0x98));
    if (zVar5 < 0) {
      return -1;
    }
    uVar4 = zVar5 + *_ctx;
    break;
  case ZIP_SOURCE_TELL:
    return *(long *)((long)_ctx + 0x28) - *_ctx;
  default:
    zVar5 = zip_source_pass_to_lower_layer(src,data,len,cmd);
    return zVar5;
  case ZIP_SOURCE_SUPPORTS:
    return *(zip_int64_t *)((long)_ctx + 0xa8);
  case ZIP_SOURCE_GET_FILE_ATTRIBUTES:
    if (0x17 < len) {
      *(undefined8 *)((long)data + 0x10) = *(undefined8 *)((long)_ctx + 0x88);
      uVar1 = *(undefined8 *)((long)_ctx + 0x80);
      *(undefined8 *)data = *(undefined8 *)((long)_ctx + 0x78);
      *(undefined8 *)((long)data + 8) = uVar1;
      return 0x18;
    }
    goto LAB_00110d1b;
  case ZIP_SOURCE_GET_DOS_TIME:
    if (3 < len) {
      if (*(char *)((long)_ctx + 0x94) != '\x01') {
        return 0;
      }
      *(undefined4 *)data = *(undefined4 *)((long)_ctx + 0x90);
      return 4;
    }
LAB_00110d1b:
    iVar2 = 0x12;
LAB_00110d24:
    zip_error_set((zip_error_t *)((long)_ctx + 0x98),iVar2,0);
    return -1;
  }
LAB_00110dc7:
  *(ulong *)((long)_ctx + 0x28) = uVar4;
LAB_00110dce:
  return 0;
}

Assistant:

static zip_int64_t
window_read(zip_source_t *src, void *_ctx, void *data, zip_uint64_t len, zip_source_cmd_t cmd) {
    struct window *ctx;
    zip_int64_t ret;
    zip_uint64_t n, i;

    ctx = (struct window *)_ctx;

    switch (cmd) {
    case ZIP_SOURCE_CLOSE:
        return 0;

    case ZIP_SOURCE_ERROR:
        return zip_error_to_data(&ctx->error, data, len);

    case ZIP_SOURCE_FREE:
        free(ctx);
        return 0;

    case ZIP_SOURCE_OPEN:
        if (ctx->source_archive) {
            zip_uint64_t offset;

            if ((offset = _zip_file_get_offset(ctx->source_archive, ctx->source_index, &ctx->error)) == 0) {
                return -1;
            }
            if (ctx->end + offset < ctx->end) {
                /* zip archive data claims end of data past zip64 limits */
                zip_error_set(&ctx->error, ZIP_ER_INCONS, MAKE_DETAIL_WITH_INDEX(ZIP_ER_DETAIL_CDIR_ENTRY_INVALID, ctx->source_index));
                return -1;
            }
            ctx->start += offset;
            ctx->end += offset;
            ctx->source_archive = NULL;
        }

        if (!ctx->needs_seek) {
            DEFINE_BYTE_ARRAY(b, BUFSIZE);

            if (!byte_array_init(b, BUFSIZE)) {
                zip_error_set(&ctx->error, ZIP_ER_MEMORY, 0);
                return -1;
            }

            for (n = 0; n < ctx->start; n += (zip_uint64_t)ret) {
                i = (ctx->start - n > BUFSIZE ? BUFSIZE : ctx->start - n);
                if ((ret = zip_source_read(src, b, i)) < 0) {
                    zip_error_set_from_source(&ctx->error, src);
                    byte_array_fini(b);
                    return -1;
                }
                if (ret == 0) {
                    zip_error_set(&ctx->error, ZIP_ER_EOF, 0);
                    byte_array_fini(b);
                    return -1;
                }
            }

            byte_array_fini(b);
        }

        ctx->offset = ctx->start;
        return 0;

    case ZIP_SOURCE_READ:
        if (ctx->end_valid && len > ctx->end - ctx->offset) {
            len = ctx->end - ctx->offset;
        }

        if (len == 0) {
            return 0;
        }

        if (ctx->needs_seek) {
            if (zip_source_seek(src, (zip_int64_t)ctx->offset, SEEK_SET) < 0) {
                zip_error_set_from_source(&ctx->error, src);
                return -1;
            }
        }

        if ((ret = zip_source_read(src, data, len)) < 0) {
            zip_error_set(&ctx->error, ZIP_ER_EOF, 0);
            return -1;
        }

        ctx->offset += (zip_uint64_t)ret;

        if (ret == 0) {
            if (ctx->end_valid && ctx->offset < ctx->end) {
                zip_error_set(&ctx->error, ZIP_ER_EOF, 0);
                return -1;
            }
        }
        return ret;

    case ZIP_SOURCE_SEEK: {
        zip_int64_t new_offset;
        
        if (!ctx->end_valid) {
            zip_source_args_seek_t *args = ZIP_SOURCE_GET_ARGS(zip_source_args_seek_t, data, len, &ctx->error);
            
            if (args == NULL) {
                return -1;
            }
            if (args->whence == SEEK_END) {
                if (zip_source_seek(src, args->offset, args->whence) < 0) {
                    zip_error_set_from_source(&ctx->error, src);
                    return -1;
                }
                new_offset = zip_source_tell(src);
                if (new_offset < 0) {
                    zip_error_set_from_source(&ctx->error, src);
                    return -1;
                }
                if ((zip_uint64_t)new_offset < ctx->start) {
                    zip_error_set(&ctx->error, ZIP_ER_INVAL, 0);
                    (void)zip_source_seek(src, (zip_int64_t)ctx->offset, SEEK_SET);
                    return -1;
                }
                ctx->offset = (zip_uint64_t)new_offset;
                return 0;
            }
        }

        new_offset = zip_source_seek_compute_offset(ctx->offset - ctx->start, ctx->end - ctx->start, data, len, &ctx->error);
        
        if (new_offset < 0) {
            return -1;
        }
        
        ctx->offset = (zip_uint64_t)new_offset + ctx->start;
        return 0;
    }

    case ZIP_SOURCE_STAT: {
        zip_stat_t *st;

        st = (zip_stat_t *)data;

        if (_zip_stat_merge(st, &ctx->stat, &ctx->error) < 0) {
            return -1;
        }

        if (!(ctx->stat.valid & ZIP_STAT_SIZE)) {
            if (ctx->end_valid) {
                st->valid |= ZIP_STAT_SIZE;
                st->size = ctx->end - ctx->start;
            }
            else if (st->valid & ZIP_STAT_SIZE) {
                st->size -= ctx->start;
            }
        }

        st->valid &= ~ctx->stat_invalid;

        return 0;
    }

    case ZIP_SOURCE_GET_FILE_ATTRIBUTES:
        if (len < sizeof(ctx->attributes)) {
            zip_error_set(&ctx->error, ZIP_ER_INVAL, 0);
            return -1;
        }

        (void)memcpy_s(data, sizeof(ctx->attributes), &ctx->attributes, sizeof(ctx->attributes));
        return sizeof(ctx->attributes);

    case ZIP_SOURCE_GET_DOS_TIME:
        if (len < sizeof(ctx->dostime)) {
            zip_error_set(&ctx->error, ZIP_ER_INVAL, 0);
            return -1;
        }
        if (ctx->dostime_valid) {
            (void)memcpy_s(data, sizeof(ctx->dostime), &ctx->dostime, sizeof(ctx->dostime));
            return sizeof(ctx->dostime);
        }
        else {
            return 0;
        }

    case ZIP_SOURCE_SUPPORTS:
        return ctx->supports;

    case ZIP_SOURCE_TELL:
        return (zip_int64_t)(ctx->offset - ctx->start);

    default:
        return zip_source_pass_to_lower_layer(src, data, len, cmd);
    }
}